

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

int bcholu(double *A,int N)

{
  int iVar1;
  double *UT;
  double *UB;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = (long)N;
  UT = (double *)malloc(lVar4 * 8 * lVar4);
  UB = (double *)malloc(0x8000);
  iVar1 = rbcholu(A,N,N,UB,UT);
  uVar2 = 0;
  uVar5 = (ulong)(uint)N;
  if (N < 1) {
    uVar5 = 0;
  }
  for (; uVar2 != uVar5; uVar2 = uVar2 + 1) {
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      A[uVar3] = 0.0;
    }
    A = A + lVar4;
  }
  free(UB);
  free(UT);
  return iVar1;
}

Assistant:

int bcholu(double *A, int N) {
	int stride,i,j,t,b,sc;
	double *UB,*UT;
	b = (int) BLOCKSIZE;
	UT = (double*) malloc(sizeof(double) * N * N);
	UB = (double*) malloc(sizeof(double) * b * b);
	stride = N; 
	
	sc = rbcholu(A,N,stride,UB,UT);
	
	for(i=0; i < N;++i) {
		t = i *N;
		for(j=0;j < i;++j) {
			A[t+j] = 0.;
		}
	}

	free(UB);
	free(UT);
	
	return sc;
	
}